

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

void __thiscall AmpIO::DisplayReadBuffer(AmpIO *this,ostream *out)

{
  uint32_t uVar1;
  uint uVar2;
  void *pvVar3;
  ostream *poVar4;
  uint local_1c;
  uint i;
  ostream *out_local;
  AmpIO *this_local;
  
  pvVar3 = (void *)std::ostream::operator<<(out,std::hex);
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,this->ReadBuffer[0]);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  pvVar3 = (void *)std::ostream::operator<<(out,std::hex);
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,this->ReadBuffer[1]);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  pvVar3 = (void *)std::ostream::operator<<(out,std::hex);
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,this->ReadBuffer[2]);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  pvVar3 = (void *)std::ostream::operator<<(out,std::hex);
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,this->ReadBuffer[3]);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  for (local_1c = 4; local_1c < this->ENC_POS_OFFSET; local_1c = local_1c + 1) {
    pvVar3 = (void *)std::ostream::operator<<(out,std::hex);
    poVar4 = (ostream *)std::ostream::operator<<(pvVar3,this->ReadBuffer[local_1c]);
    std::operator<<(poVar4," ");
  }
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  for (local_1c = this->ENC_POS_OFFSET; local_1c < this->ENC_VEL_OFFSET; local_1c = local_1c + 1) {
    pvVar3 = (void *)std::ostream::operator<<(out,std::hex);
    poVar4 = (ostream *)std::ostream::operator<<(pvVar3,this->ReadBuffer[local_1c]);
    std::operator<<(poVar4," ");
  }
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  for (local_1c = this->ENC_VEL_OFFSET; local_1c < this->ENC_QTR1_OFFSET; local_1c = local_1c + 1) {
    pvVar3 = (void *)std::ostream::operator<<(out,std::hex);
    poVar4 = (ostream *)std::ostream::operator<<(pvVar3,this->ReadBuffer[local_1c]);
    std::operator<<(poVar4," ");
  }
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  for (local_1c = this->ENC_QTR1_OFFSET; local_1c < this->ENC_QTR5_OFFSET; local_1c = local_1c + 1)
  {
    pvVar3 = (void *)std::ostream::operator<<(out,std::hex);
    poVar4 = (ostream *)std::ostream::operator<<(pvVar3,this->ReadBuffer[local_1c]);
    std::operator<<(poVar4," ");
  }
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  for (local_1c = this->ENC_QTR5_OFFSET; local_1c < this->ENC_RUN_OFFSET; local_1c = local_1c + 1) {
    pvVar3 = (void *)std::ostream::operator<<(out,std::hex);
    poVar4 = (ostream *)std::ostream::operator<<(pvVar3,this->ReadBuffer[local_1c]);
    std::operator<<(poVar4," ");
  }
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  for (local_1c = this->ENC_RUN_OFFSET; local_1c < this->MOTOR_STATUS_OFFSET;
      local_1c = local_1c + 1) {
    pvVar3 = (void *)std::ostream::operator<<(out,std::hex);
    poVar4 = (ostream *)std::ostream::operator<<(pvVar3,this->ReadBuffer[local_1c]);
    std::operator<<(poVar4," ");
  }
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (7 < uVar1) {
    local_1c = this->MOTOR_STATUS_OFFSET;
    while( true ) {
      uVar2 = (*(this->super_FpgaIO).super_BoardIO._vptr_BoardIO[1])();
      if (uVar2 >> 2 <= local_1c) break;
      pvVar3 = (void *)std::ostream::operator<<(out,std::hex);
      poVar4 = (ostream *)std::ostream::operator<<(pvVar3,this->ReadBuffer[local_1c]);
      std::operator<<(poVar4," ");
      local_1c = local_1c + 1;
    }
    std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  }
  std::ostream::operator<<(out,std::dec);
  return;
}

Assistant:

void AmpIO::DisplayReadBuffer(std::ostream &out) const
{
    // first two quadlets are timestamp and status, resp.
    out << std::hex << ReadBuffer[TIMESTAMP_OFFSET] << std::endl;
    out << std::hex << ReadBuffer[STATUS_OFFSET] << std::endl;
    // next two quadlets are digital I/O and amplifier temperature
    out << std::hex << ReadBuffer[DIGIO_OFFSET] << std::endl;
    out << std::hex << ReadBuffer[TEMP_OFFSET] << std::endl;

    // remaining quadlets are in groups of NumMotors/NumEncoders as follows:
    //   - motor current and analog pot per channel
    //   - encoder position per channel
    //   - encoder velocity per channel
    //   - encoder acceleration data (depends on firmware version)
    unsigned int i;
    for (i = MOTOR_CURR_OFFSET; i < ENC_POS_OFFSET; i++)
        out << std::hex << ReadBuffer[i] << " ";
    out << std::endl;
    for (i = ENC_POS_OFFSET; i < ENC_VEL_OFFSET; i++)
        out << std::hex << ReadBuffer[i] << " ";
    out << std::endl;
    for (i = ENC_VEL_OFFSET; i < ENC_QTR1_OFFSET; i++)
        out << std::hex << ReadBuffer[i] << " ";
    out << std::endl;
    for (i = ENC_QTR1_OFFSET; i < ENC_QTR5_OFFSET; i++)
        out << std::hex << ReadBuffer[i] << " ";
    out << std::endl;
    for (i = ENC_QTR5_OFFSET; i < ENC_RUN_OFFSET; i++)
        out << std::hex << ReadBuffer[i] << " ";
    out << std::endl;
    for (i = ENC_RUN_OFFSET; i < MOTOR_STATUS_OFFSET; i++)
        out << std::hex << ReadBuffer[i] << " ";
    out << std::endl;
    if (GetFirmwareVersion() >= 8) {
        for (i = MOTOR_STATUS_OFFSET; i < GetReadNumBytes()/sizeof(quadlet_t); i++)
            out << std::hex << ReadBuffer[i] << " ";
        out << std::endl;
    }
    out << std::dec;
}